

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _w;
  uint _h;
  uint _c;
  ulong uVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  float fVar9;
  
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  if (iVar1 == 3) {
    _c = bottom_blob->c;
    Mat::create(top_blob,_w,_h,_c,1,opt->blob_allocator);
    iVar8 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar8 = 0;
      uVar2 = (ulong)_c;
      if ((int)_c < 1) {
        uVar2 = 0;
      }
      lVar6 = 0;
      for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
        uVar3 = uVar7;
        if (this->scale_in_data_size == 1) {
          uVar3 = 0;
        }
        if (this->bias_data_size == 0) {
          fVar9 = 0.0;
        }
        else {
          if (this->bias_data_size == 1) {
            pfVar4 = (float *)(this->bias_data).data;
          }
          else {
            pfVar4 = (float *)((long)(this->bias_data).data + lVar6);
          }
          fVar9 = *pfVar4;
        }
        uVar5 = 0;
        if (this->scale_out_data_size != 1) {
          uVar5 = uVar7;
        }
        requantize((int *)(bottom_blob->cstep * uVar7 * bottom_blob->elemsize +
                          (long)bottom_blob->data),
                   (char *)(top_blob->cstep * uVar7 * top_blob->elemsize + (long)top_blob->data),
                   *(float *)((long)(this->scale_in_data).data + uVar3 * 4),fVar9,
                   *(float *)((long)(this->scale_out_data).data + uVar5 * 4),this->activation_type,
                   &this->activation_params,_h * _w);
        lVar6 = lVar6 + 4;
      }
    }
  }
  else if (iVar1 == 2) {
    Mat::create(top_blob,_w,_h,1,opt->blob_allocator);
    iVar8 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar8 = 0;
      uVar2 = (ulong)_h;
      if ((int)_h < 1) {
        uVar2 = 0;
      }
      lVar6 = 0;
      for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
        uVar3 = uVar7;
        if (this->scale_in_data_size == 1) {
          uVar3 = 0;
        }
        if (this->bias_data_size == 0) {
          fVar9 = 0.0;
        }
        else {
          if (this->bias_data_size == 1) {
            pfVar4 = (float *)(this->bias_data).data;
          }
          else {
            pfVar4 = (float *)((long)(this->bias_data).data + lVar6);
          }
          fVar9 = *pfVar4;
        }
        uVar5 = 0;
        if (this->scale_out_data_size != 1) {
          uVar5 = uVar7;
        }
        requantize((int *)((long)bottom_blob->w * uVar7 * bottom_blob->elemsize +
                          (long)bottom_blob->data),
                   (char *)((long)top_blob->w * uVar7 * top_blob->elemsize + (long)top_blob->data),
                   *(float *)((long)(this->scale_in_data).data + uVar3 * 4),fVar9,
                   *(float *)((long)(this->scale_out_data).data + uVar5 * 4),this->activation_type,
                   &this->activation_params,_w);
        lVar6 = lVar6 + 4;
      }
    }
  }
  else {
    iVar8 = 0;
    if (iVar1 == 1) {
      Mat::create(top_blob,_w,1,opt->blob_allocator);
      iVar8 = -100;
      if (((char *)top_blob->data != (char *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (this->bias_data_size == 0) {
          fVar9 = 0.0;
        }
        else {
          fVar9 = *(this->bias_data).data;
        }
        requantize((int *)bottom_blob->data,(char *)top_blob->data,*(this->scale_in_data).data,fVar9
                   ,*(this->scale_out_data).data,this->activation_type,&this->activation_params,_w);
        iVar8 = 0;
      }
    }
  }
  return iVar8;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    if (dims == 1)
    {
        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        // assert scale_in_data_size == 1
        // assert bias_data_size == 0 || bias_data_size == 1
        // assert scale_out_data_size == 1

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        const float scale_in = scale_in_data[0];
        const float bias = bias_data_size == 0 ? 0.f : bias_data[0];
        const float scale_out = scale_out_data[0];

        requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w);
    }

    if (dims == 2)
    {
        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            signed char* ptr = top_blob.row<signed char>(i);

            const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[i];
            const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

            requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            signed char* ptr = top_blob.channel(q);

            const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[q];
            const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

            requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w * h);
        }
    }

    return 0;
}